

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node,REF_INT *nodes,REF_INT node,REF_DBL *angle)

{
  double dVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL edge2 [3];
  double local_58;
  REF_DBL edge1 [3];
  REF_INT local_38;
  REF_INT i;
  REF_INT node2;
  REF_INT node1;
  REF_DBL *angle_local;
  REF_INT node_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  *angle = -9.0;
  i = -1;
  local_38 = -1;
  if (node == *nodes) {
    i = nodes[1];
    local_38 = nodes[2];
  }
  if (node == nodes[1]) {
    i = nodes[2];
    local_38 = *nodes;
  }
  if (node == nodes[2]) {
    i = *nodes;
    local_38 = nodes[1];
  }
  if ((i == -1) || (local_38 == -1)) {
    ref_node_local._4_4_ = 5;
  }
  else {
    for (edge1[2]._4_4_ = 0; edge1[2]._4_4_ < 3; edge1[2]._4_4_ = edge1[2]._4_4_ + 1) {
      edge1[(long)edge1[2]._4_4_ + -1] =
           ref_node->real[edge1[2]._4_4_ + i * 0xf] - ref_node->real[edge1[2]._4_4_ + node * 0xf];
      *(double *)(&ref_private_macro_code_rss_1 + (long)edge1[2]._4_4_ * 2) =
           ref_node->real[edge1[2]._4_4_ + local_38 * 0xf] -
           ref_node->real[edge1[2]._4_4_ + node * 0xf];
    }
    ref_node_local._4_4_ = ref_math_normalize(&local_58);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_1);
      if (ref_node_local._4_4_ == 0) {
        dVar1 = acos(edge1[1] * edge2[1] +
                     local_58 * _ref_private_macro_code_rss_1 + edge1[0] * edge2[0]);
        *angle = dVar1;
        ref_node_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x926,"ref_node_tri_node_angle",(ulong)ref_node_local._4_4_,
               "normalize zero length edge2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x925,
             "ref_node_tri_node_angle",(ulong)ref_node_local._4_4_,"normalize zero length edge1");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node, REF_INT *nodes,
                                           REF_INT node, REF_DBL *angle) {
  REF_INT node1, node2, i;
  REF_DBL edge1[3], edge2[3];

  *angle = -9.0;

  node1 = REF_EMPTY;
  node2 = REF_EMPTY;
  if (node == nodes[0]) {
    node1 = nodes[1];
    node2 = nodes[2];
  }
  if (node == nodes[1]) {
    node1 = nodes[2];
    node2 = nodes[0];
  }
  if (node == nodes[2]) {
    node1 = nodes[0];
    node2 = nodes[1];
  }
  if (REF_EMPTY == node1 || REF_EMPTY == node2) return REF_NOT_FOUND;

  for (i = 0; i < 3; i++) {
    edge1[i] =
        ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
    edge2[i] =
        ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
  }

  RSS(ref_math_normalize(edge1), "normalize zero length edge1");
  RSS(ref_math_normalize(edge2), "normalize zero length edge2");
  *angle = acos(ref_math_dot(edge1, edge2));

  return REF_SUCCESS;
}